

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *this,string_t *s,bool ensure_ascii)

{
  byte byte;
  error_handler_t eVar1;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *psVar2;
  uint8_t uVar3;
  _func_int **pp_Var4;
  type_error *ptVar5;
  undefined7 in_register_00000011;
  char *pcVar6;
  element_type *peVar7;
  ulong __val;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 uStack_100;
  uint8_t state;
  array<char,_512UL> *local_f0;
  undefined4 local_e4;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_e0;
  uint32_t codepoint;
  string sn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e4 = (undefined4)CONCAT71(in_register_00000011,ensure_ascii);
  state = '\0';
  local_f0 = &this->string_buffer;
  lVar9 = 0;
  lVar10 = 0;
  __val = 0;
  lVar8 = 0;
  local_e0 = this;
  do {
    psVar2 = local_e0;
    if (s->_M_string_length <= __val) {
      if (state == '\0') {
        if (lVar8 == 0) {
          return;
        }
        peVar7 = (local_e0->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        pp_Var4 = peVar7->_vptr_output_adapter_protocol;
        lVar9 = lVar8;
      }
      else {
        eVar1 = local_e0->error_handler;
        if (eVar1 == replace) {
          peVar7 = (local_e0->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar7->_vptr_output_adapter_protocol[1])(peVar7,local_f0,lVar9);
          peVar7 = (psVar2->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if ((byte)local_e4 == '\0') {
            pcVar6 = anon_var_dwarf_205ca;
            uStack_100 = 3;
          }
          else {
            pcVar6 = "\\ufffd";
            uStack_100 = 6;
          }
          (*peVar7->_vptr_output_adapter_protocol[1])(peVar7,pcVar6,uStack_100);
          return;
        }
        if (eVar1 != ignore) {
          if (eVar1 == strict) {
            sn._M_dataplus._M_p = (pointer)&sn.field_2;
            std::__cxx11::string::_M_construct((ulong)&sn,'\x03');
            snprintf(sn._M_dataplus._M_p,sn._M_string_length,"%.2X",
                     (ulong)(byte)(s->_M_dataplus)._M_p[s->_M_string_length - 1]);
            ptVar5 = (type_error *)__cxa_allocate_exception(0x20);
            std::operator+(&local_b0,"incomplete UTF-8 string; last byte: 0x",&sn);
            type_error::create(ptVar5,0x13c,&local_b0);
            __cxa_throw(ptVar5,&type_error::typeinfo,exception::~exception);
          }
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Edward-Elric233[P]LinuxNetworkProgramming/lib/json.hpp"
                        ,0x3ebc,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        peVar7 = (local_e0->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        pp_Var4 = peVar7->_vptr_output_adapter_protocol;
      }
      (*pp_Var4[1])(peVar7,local_f0,lVar9);
      return;
    }
    byte = (s->_M_dataplus)._M_p[__val];
    uVar3 = decode(&state,&codepoint,byte);
    if (uVar3 == '\x01') {
      eVar1 = local_e0->error_handler;
      if (1 < eVar1 - replace) {
        if (eVar1 == strict) {
          sn._M_dataplus._M_p = (pointer)&sn.field_2;
          std::__cxx11::string::_M_construct((ulong)&sn,'\x03');
          snprintf(sn._M_dataplus._M_p,sn._M_string_length,"%.2X",(ulong)byte);
          ptVar5 = (type_error *)__cxa_allocate_exception(0x20);
          std::__cxx11::to_string(&local_90,__val);
          std::operator+(&local_70,"invalid UTF-8 byte at index ",&local_90);
          std::operator+(&local_50,&local_70,": 0x");
          std::operator+(&local_b0,&local_50,&sn);
          type_error::create(ptVar5,0x13c,&local_b0);
          __cxa_throw(ptVar5,&type_error::typeinfo,exception::~exception);
        }
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Edward-Elric233[P]LinuxNetworkProgramming/lib/json.hpp"
                      ,0x3e7d,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      __val = (__val - 1) + (ulong)(lVar10 == 0);
      if (eVar1 == replace) {
        if ((byte)local_e4 == 0) {
          (local_f0->_M_elems + lVar9)[0] = -0x11;
          (local_f0->_M_elems + lVar9)[1] = -0x41;
          local_f0->_M_elems[lVar9 + 2] = -0x43;
          lVar9 = lVar9 + 3;
        }
        else {
          builtin_strncpy(local_f0->_M_elems + lVar9,"\\ufffd",6);
          lVar9 = lVar9 + 6;
        }
        if (lVar9 - 500U < 0xd) {
          peVar7 = (local_e0->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar7->_vptr_output_adapter_protocol[1])(peVar7,local_f0,lVar9);
          lVar9 = 0;
        }
      }
      state = '\0';
LAB_00108557:
      lVar10 = 0;
      lVar8 = lVar9;
    }
    else if (uVar3 == '\0') {
      switch(codepoint) {
      case 8:
        (local_f0->_M_elems + lVar8)[0] = '\\';
        (local_f0->_M_elems + lVar8)[1] = 'b';
        break;
      case 9:
        (local_f0->_M_elems + lVar8)[0] = '\\';
        (local_f0->_M_elems + lVar8)[1] = 't';
        break;
      case 10:
        (local_f0->_M_elems + lVar8)[0] = '\\';
        (local_f0->_M_elems + lVar8)[1] = 'n';
        break;
      case 0xb:
switchD_001083b4_caseD_b:
        if ((0x1f < codepoint & ((byte)local_e4 ^ 1 | codepoint < 0x7f)) == 0) {
          if (codepoint < 0x10000) {
            snprintf(local_f0->_M_elems + lVar8,7,"\\u%04x",(ulong)codepoint);
            lVar9 = lVar8 + 6;
          }
          else {
            snprintf(local_f0->_M_elems + lVar8,0xd,"\\u%04x\\u%04x",
                     (ulong)((codepoint >> 10) + 0xd7c0 & 0xffff),
                     (ulong)(codepoint & 0x3ff | 0xdc00));
            lVar9 = lVar8 + 0xc;
          }
        }
        else {
          local_f0->_M_elems[lVar8] = (s->_M_dataplus)._M_p[__val];
          lVar9 = lVar8 + 1;
        }
        goto LAB_00108527;
      case 0xc:
        (local_f0->_M_elems + lVar8)[0] = '\\';
        (local_f0->_M_elems + lVar8)[1] = 'f';
        break;
      case 0xd:
        (local_f0->_M_elems + lVar8)[0] = '\\';
        (local_f0->_M_elems + lVar8)[1] = 'r';
        break;
      default:
        if (codepoint == 0x22) {
          (local_f0->_M_elems + lVar8)[0] = '\\';
          (local_f0->_M_elems + lVar8)[1] = '\"';
        }
        else {
          if (codepoint != 0x5c) goto switchD_001083b4_caseD_b;
          (local_f0->_M_elems + lVar8)[0] = '\\';
          (local_f0->_M_elems + lVar8)[1] = '\\';
        }
      }
      lVar9 = lVar8 + 2;
LAB_00108527:
      if (0xc < lVar9 - 500U) goto LAB_00108557;
      peVar7 = (local_e0->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar7->_vptr_output_adapter_protocol[1])(peVar7,local_f0,lVar9);
      lVar9 = 0;
      lVar10 = 0;
      lVar8 = 0;
    }
    else {
      if ((byte)local_e4 == 0) {
        local_f0->_M_elems[lVar8] = (s->_M_dataplus)._M_p[__val];
        lVar8 = lVar8 + 1;
      }
      lVar10 = lVar10 + 1;
    }
    __val = __val + 1;
  } while( true );
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
    {
        std::uint32_t codepoint;
        std::uint8_t state = UTF8_ACCEPT;
        std::size_t bytes = 0;  // number of bytes written to string_buffer

        // number of bytes written at the point of the last valid byte
        std::size_t bytes_after_last_accept = 0;
        std::size_t undumped_chars = 0;

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(s[i]);

            switch (decode(state, codepoint, byte))
            {
                case UTF8_ACCEPT:  // decode found a new code point
                {
                    switch (codepoint)
                    {
                        case 0x08: // backspace
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'b';
                            break;
                        }

                        case 0x09: // horizontal tab
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 't';
                            break;
                        }

                        case 0x0A: // newline
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'n';
                            break;
                        }

                        case 0x0C: // formfeed
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'f';
                            break;
                        }

                        case 0x0D: // carriage return
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'r';
                            break;
                        }

                        case 0x22: // quotation mark
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\"';
                            break;
                        }

                        case 0x5C: // reverse solidus
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\\';
                            break;
                        }

                        default:
                        {
                            // escape control characters (0x00..0x1F) or, if
                            // ensure_ascii parameter is used, non-ASCII characters
                            if ((codepoint <= 0x1F) || (ensure_ascii && (codepoint >= 0x7F)))
                            {
                                if (codepoint <= 0xFFFF)
                                {
                                    (std::snprintf)(string_buffer.data() + bytes, 7, "\\u%04x",
                                                    static_cast<std::uint16_t>(codepoint));
                                    bytes += 6;
                                }
                                else
                                {
                                    (std::snprintf)(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
                                                    static_cast<std::uint16_t>(0xD7C0u + (codepoint >> 10u)),
                                                    static_cast<std::uint16_t>(0xDC00u + (codepoint & 0x3FFu)));
                                    bytes += 12;
                                }
                            }
                            else
                            {
                                // copy byte to buffer (all previous bytes
                                // been copied have in default case above)
                                string_buffer[bytes++] = s[i];
                            }
                            break;
                        }
                    }

                    // write buffer and reset index; there must be 13 bytes
                    // left, as this is the maximal number of bytes to be
                    // written ("\uxxxx\uxxxx\0") for one code point
                    if (string_buffer.size() - bytes < 13)
                    {
                        o->write_characters(string_buffer.data(), bytes);
                        bytes = 0;
                    }

                    // remember the byte position of this accept
                    bytes_after_last_accept = bytes;
                    undumped_chars = 0;
                    break;
                }

                case UTF8_REJECT:  // decode found invalid UTF-8 byte
                {
                    switch (error_handler)
                    {
                        case error_handler_t::strict:
                        {
                            std::string sn(3, '\0');
                            (std::snprintf)(&sn[0], sn.size(), "%.2X", byte);
                            JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + sn));
                        }

                        case error_handler_t::ignore:
                        case error_handler_t::replace:
                        {
                            // in case we saw this character the first time, we
                            // would like to read it again, because the byte
                            // may be OK for itself, but just not OK for the
                            // previous sequence
                            if (undumped_chars > 0)
                            {
                                --i;
                            }

                            // reset length buffer to the last accepted index;
                            // thus removing/ignoring the invalid characters
                            bytes = bytes_after_last_accept;

                            if (error_handler == error_handler_t::replace)
                            {
                                // add a replacement character
                                if (ensure_ascii)
                                {
                                    string_buffer[bytes++] = '\\';
                                    string_buffer[bytes++] = 'u';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'd';
                                }
                                else
                                {
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xEF');
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xBF');
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xBD');
                                }

                                // write buffer and reset index; there must be 13 bytes
                                // left, as this is the maximal number of bytes to be
                                // written ("\uxxxx\uxxxx\0") for one code point
                                if (string_buffer.size() - bytes < 13)
                                {
                                    o->write_characters(string_buffer.data(), bytes);
                                    bytes = 0;
                                }

                                bytes_after_last_accept = bytes;
                            }

                            undumped_chars = 0;

                            // continue processing the string
                            state = UTF8_ACCEPT;
                            break;
                        }

                        default:            // LCOV_EXCL_LINE
                            JSON_ASSERT(false);  // LCOV_EXCL_LINE
                    }
                    break;
                }

                default:  // decode found yet incomplete multi-byte code point
                {
                    if (!ensure_ascii)
                    {
                        // code point will not be escaped - copy byte to buffer
                        string_buffer[bytes++] = s[i];
                    }
                    ++undumped_chars;
                    break;
                }
            }
        }

        // we finished processing the string
        if (JSON_HEDLEY_LIKELY(state == UTF8_ACCEPT))
        {
            // write buffer
            if (bytes > 0)
            {
                o->write_characters(string_buffer.data(), bytes);
            }
        }
        else
        {
            // we finish reading, but do not accept: string was incomplete
            switch (error_handler)
            {
                case error_handler_t::strict:
                {
                    std::string sn(3, '\0');
                    (std::snprintf)(&sn[0], sn.size(), "%.2X", static_cast<std::uint8_t>(s.back()));
                    JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + sn));
                }

                case error_handler_t::ignore:
                {
                    // write all accepted bytes
                    o->write_characters(string_buffer.data(), bytes_after_last_accept);
                    break;
                }

                case error_handler_t::replace:
                {
                    // write all accepted bytes
                    o->write_characters(string_buffer.data(), bytes_after_last_accept);
                    // add a replacement character
                    if (ensure_ascii)
                    {
                        o->write_characters("\\ufffd", 6);
                    }
                    else
                    {
                        o->write_characters("\xEF\xBF\xBD", 3);
                    }
                    break;
                }

                default:            // LCOV_EXCL_LINE
                    JSON_ASSERT(false);  // LCOV_EXCL_LINE
            }
        }
    }